

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeLPF(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  undefined8 *puVar1;
  SPxSense SVar2;
  pointer pnVar3;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  ostream *poVar8;
  Item *pIVar9;
  int i;
  int iVar10;
  long lVar11;
  char *pcVar12;
  cpp_dec_float<50U,_int,_void> *p_lhs;
  int j;
  long lVar13;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  svec;
  char name_2 [16];
  char name [16];
  char name_1 [16];
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar13 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar13 + -0x18) + 8) = 0x10;
  lVar13 = *(long *)(lVar13 + -0x18);
  *(uint *)(p_output + lVar13 + 0x18) = *(uint *)(p_output + lVar13 + 0x18) & 0xfffffefb | 0x100;
  SVar2 = this->thesense;
  pcVar12 = "Maximize\n";
  if ((long)SVar2 == -1) {
    pcVar12 = "Minimize\n";
  }
  std::operator<<(p_output,pcVar12);
  std::operator<<(p_output,"  obj: ");
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&svec,(int)(((long)(this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).object.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x38));
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&svec,&(this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).object);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<50U,_int,_void> *)name_2,(long)SVar2,(type *)0x0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator*=(&svec.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)name_2);
  LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (this,p_output,p_cnames,
             &svec.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,writeZeroObjective);
  std::operator<<(p_output,"\n");
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~DSVectorBase(&svec);
  std::operator<<(p_output,"Subject To\n");
  lVar13 = 6;
  for (lVar11 = 0;
      lVar11 < (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar11 = lVar11 + 1) {
    pcVar12 = (char *)((long)&(((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).left.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                      lVar13 * 8 + -0x30);
    name_2._0_8_ = *(undefined8 *)pcVar12;
    name_2._8_8_ = *(undefined8 *)(pcVar12 + 8);
    pnVar3 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar13 * 8 + -0x30);
    svec._vptr_DSVectorBase = (_func_int **)*puVar1;
    svec.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar13 * 8 + -0x20);
    svec.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ._8_8_ = *puVar1;
    svec.theelem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)puVar1[1];
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_68,-*pdVar7,(type *)0x0);
    tVar4 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)name_2,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_68);
    iVar10 = (int)lVar11;
    if (tVar4) {
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)name_1,*pdVar7,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&svec,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)name_1);
      if ((!tVar4) ||
         (bVar5 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)name_2,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&svec), !bVar5)) goto LAB_001dd122;
      poVar8 = std::operator<<(p_output," ");
      pcVar12 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (this,iVar10,p_rnames,name,iVar10);
      poVar8 = std::operator<<(poVar8,pcVar12);
      std::operator<<(poVar8,"_1 : ");
      iVar6 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar11].idx;
      pIVar9 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,*pdVar7,(type *)0x0);
      LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (this,p_output,p_cnames,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(pIVar9 + iVar6),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)name_2,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_68);
      poVar8 = std::operator<<(p_output," ");
      pcVar12 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (this,iVar10,p_rnames,name,iVar10);
      poVar8 = std::operator<<(poVar8,pcVar12);
      std::operator<<(poVar8,"_2 : ");
      pIVar9 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar11].idx;
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,-*pdVar7,(type *)0x0);
      p_lhs = &local_68;
    }
    else {
LAB_001dd122:
      poVar8 = std::operator<<(p_output," ");
      pcVar12 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (this,iVar10,p_rnames,name,iVar10);
      poVar8 = std::operator<<(poVar8,pcVar12);
      std::operator<<(poVar8," : ");
      pIVar9 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar11].idx;
      p_lhs = (cpp_dec_float<50U,_int,_void> *)name_2;
    }
    LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (this,p_output,p_cnames,
               (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)pIVar9,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)p_lhs,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&svec);
    lVar13 = lVar13 + 7;
  }
  std::operator<<(p_output,"Bounds\n");
  lVar13 = 0x30;
  lVar11 = 0;
  do {
    if ((this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= lVar11) {
      if ((p_intvars != (DIdxSet *)0x0) && (0 < (p_intvars->super_IdxSet).num)) {
        std::operator<<(p_output,"Generals\n");
        for (iVar10 = 0;
            iVar10 < (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum; iVar10 = iVar10 + 1) {
          iVar6 = IdxSet::pos(&p_intvars->super_IdxSet,iVar10);
          if (-1 < iVar6) {
            poVar8 = std::operator<<(p_output,"  ");
            pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar10,p_cnames,name_2);
            poVar8 = std::operator<<(poVar8,pcVar12);
            std::operator<<(poVar8,"\n");
          }
        }
      }
      poVar8 = std::operator<<(p_output,"End");
      std::endl<char,std::char_traits<char>>(poVar8);
      return;
    }
    pcVar12 = (char *)((long)&(((this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).low.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                      lVar13 + -0x30);
    name_2._0_8_ = *(undefined8 *)pcVar12;
    name_2._8_8_ = *(undefined8 *)(pcVar12 + 8);
    pnVar3 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar13 + -0x30);
    svec._vptr_DSVectorBase = (_func_int **)*puVar1;
    svec.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar13 + -0x20);
    svec.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ._8_8_ = *puVar1;
    svec.theelem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)puVar1[1];
    bVar5 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)name_2,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&svec);
    iVar10 = (int)lVar11;
    if (bVar5) {
      poVar8 = std::operator<<(p_output,"  ");
      pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (this,iVar10,p_cnames,name_1);
      poVar8 = std::operator<<(poVar8,pcVar12);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = boost::multiprecision::operator<<
                         (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&svec);
LAB_001dd2c5:
      std::operator<<(poVar8,'\n');
    }
    else {
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,-*pdVar7,(type *)0x0);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)name_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_68);
      if (tVar4) {
        pdVar7 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_68,*pdVar7,(type *)0x0);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&svec,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_68);
        if (tVar4) {
          local_68.data._M_elems[0] = 0;
          tVar4 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)name_2,(int *)&local_68);
          poVar8 = std::operator<<(p_output,"  ");
          if (tVar4) {
            poVar8 = boost::multiprecision::operator<<
                               (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)name_2);
            poVar8 = std::operator<<(poVar8," <= ");
            pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar10,p_cnames,name_1);
            poVar8 = std::operator<<(poVar8,pcVar12);
            poVar8 = std::operator<<(poVar8," <= ");
            goto LAB_001dd42b;
          }
          pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar10,p_cnames,name_1);
          poVar8 = std::operator<<(poVar8,pcVar12);
          poVar8 = std::operator<<(poVar8," <= ");
          poVar8 = boost::multiprecision::operator<<
                             (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&svec);
          std::operator<<(poVar8,'\n');
        }
        else {
          local_68.data._M_elems[0] = 0;
          tVar4 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)name_2,(int *)&local_68);
          if (tVar4) {
            poVar8 = std::operator<<(p_output,"  ");
            poVar8 = boost::multiprecision::operator<<
                               (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)name_2);
            poVar8 = std::operator<<(poVar8," <= ");
            pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar10,p_cnames,name_1);
            poVar8 = std::operator<<(poVar8,pcVar12);
            goto LAB_001dd2c5;
          }
        }
      }
      else {
        pdVar7 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_68,*pdVar7,(type *)0x0);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&svec,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_68);
        if (tVar4) {
          poVar8 = std::operator<<(p_output,"   -Inf <= ");
          pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar10,p_cnames,name_1);
          poVar8 = std::operator<<(poVar8,pcVar12);
          poVar8 = std::operator<<(poVar8," <= ");
LAB_001dd42b:
          poVar8 = boost::multiprecision::operator<<
                             (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&svec);
          std::operator<<(poVar8,'\n');
        }
        else {
          poVar8 = std::operator<<(p_output,"  ");
          pcVar12 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar10,p_cnames,name_1);
          poVar8 = std::operator<<(poVar8,pcVar12);
          std::operator<<(poVar8," free\n");
        }
      }
    }
    lVar11 = lVar11 + 1;
    lVar13 = lVar13 + 0x38;
  } while( true );
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}